

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

ostream * __thiscall
parser::Parser::dotStringify(Parser *this,ostream *out,Grammar *grammar,CanonicalSet *canonicalSet)

{
  bool bVar1;
  ostream *poVar2;
  const_reference pvVar3;
  pointer pCVar4;
  const_reference __v;
  _Rb_tree_node_base *p_Var5;
  pointer pCVar6;
  size_t i;
  ulong uVar7;
  pointer pSVar8;
  ulong __n;
  UniqueGrammaticSymbols uniqueGrammaticSymbols;
  Situations goToSits;
  _Rb_tree<parser::GrammaticSymbol,_parser::GrammaticSymbol,_std::_Identity<parser::GrammaticSymbol>,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
  local_98;
  Situations local_68;
  string local_50;
  
  poVar2 = std::operator<<(out,"digraph CanonicalSet {");
  std::endl<char,std::char_traits<char>>(poVar2);
  uVar7 = 0;
  while( true ) {
    pCVar6 = (canonicalSet->
             super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pCVar4 = (canonicalSet->
             super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pCVar4 - (long)pCVar6 >> 5) <= uVar7) break;
    poVar2 = std::operator<<(out,"I");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"[label=\"");
    pvVar3 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                       (canonicalSet,uVar7);
    for (pSVar8 = (pvVar3->situations).
                  super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pvVar3 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                           (canonicalSet,uVar7),
        pSVar8 != (pvVar3->situations).
                  super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
                  super__Vector_impl_data._M_finish; pSVar8 = pSVar8 + 1) {
      pvVar3 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                         (canonicalSet,uVar7);
      if (pSVar8 != (pvVar3->situations).
                    super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
        std::operator<<(out,"\n");
      }
      (*(pSVar8->super_Convolution)._vptr_Convolution[1])
                (pSVar8,out,&this->terminalNames,&this->nonTerminalNames);
    }
    std::operator<<(out,"\"]\n");
    uVar7 = uVar7 + 1;
  }
  for (uVar7 = 0; uVar7 < (ulong)((long)pCVar4 - (long)pCVar6 >> 5); uVar7 = uVar7 + 1) {
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    pvVar3 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                       (canonicalSet,uVar7);
    for (pSVar8 = (pvVar3->situations).
                  super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pvVar3 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                           (canonicalSet,uVar7),
        p_Var5 = local_98._M_impl.super__Rb_tree_header._M_header._M_left,
        pSVar8 != (pvVar3->situations).
                  super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
                  super__Vector_impl_data._M_finish; pSVar8 = pSVar8 + 1) {
      if ((long)(pSVar8->super_Convolution).body.
                super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pSVar8->super_Convolution).body.
                super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3 != pSVar8->point) {
        __v = std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>::at
                        (&(pSVar8->super_Convolution).body,pSVar8->point);
        std::
        _Rb_tree<parser::GrammaticSymbol,parser::GrammaticSymbol,std::_Identity<parser::GrammaticSymbol>,std::less<parser::GrammaticSymbol>,std::allocator<parser::GrammaticSymbol>>
        ::_M_insert_unique<parser::GrammaticSymbol_const&>
                  ((_Rb_tree<parser::GrammaticSymbol,parser::GrammaticSymbol,std::_Identity<parser::GrammaticSymbol>,std::less<parser::GrammaticSymbol>,std::allocator<parser::GrammaticSymbol>>
                    *)&local_98,__v);
      }
    }
    for (; (_Rb_tree_header *)p_Var5 != &local_98._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      pvVar3 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                         (canonicalSet,uVar7);
      goTo(&local_68,this,grammar,&pvVar3->situations,(GrammaticSymbol *)(p_Var5 + 1));
      for (__n = 0; __n < (ulong)((long)(canonicalSet->
                                        super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(canonicalSet->
                                        super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5);
          __n = __n + 1) {
        pvVar3 = std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::at
                           (canonicalSet,__n);
        bVar1 = std::operator==(&local_68,&pvVar3->situations);
        if (bVar1) {
          poVar2 = std::operator<<(out,"I");
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          poVar2 = std::operator<<(poVar2," -> ");
          poVar2 = std::operator<<(poVar2,"I");
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          poVar2 = std::operator<<(poVar2," [label=\"");
          if (p_Var5[1].field_0x4 == '\x01') {
            lexer::terminalName(&local_50,p_Var5[1]._M_color,&this->terminalNames);
          }
          else {
            nonTerminalName(&local_50,p_Var5[1]._M_color,&this->nonTerminalNames);
          }
          poVar2 = std::operator<<(poVar2,(string *)&local_50);
          poVar2 = std::operator<<(poVar2,"\"]");
          std::endl<char,std::char_traits<char>>(poVar2);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector(&local_68);
    }
    std::
    _Rb_tree<parser::GrammaticSymbol,_parser::GrammaticSymbol,_std::_Identity<parser::GrammaticSymbol>,_std::less<parser::GrammaticSymbol>,_std::allocator<parser::GrammaticSymbol>_>
    ::~_Rb_tree(&local_98);
    pCVar6 = (canonicalSet->
             super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pCVar4 = (canonicalSet->
             super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  }
  std::operator<<(out,"}");
  return out;
}

Assistant:

std::ostream& dotStringify(std::ostream& out, Grammar const& grammar,
                                   CanonicalSet const& canonicalSet) {
            out << "digraph CanonicalSet {" << std::endl;

            for (size_t i = 0; i < canonicalSet.size(); ++i) {
                out << "I" << i << "[label=\"";
                for_each_c(Situations, canonicalSet.at(i).situations, sit) {
                    if (sit != canonicalSet.at(i).situations.begin()) out  << "\n";
                    sit->stringify(out, terminalNames, nonTerminalNames);
                }
                out << "\"]\n";
            }

            for (size_t i = 0; i < canonicalSet.size(); ++i) {
                UniqueGrammaticSymbols uniqueGrammaticSymbols;
                for_each_c(Situations, canonicalSet.at(i).situations, situation) {
                    if (situation->body.size() == situation->point)
                        continue;
                    uniqueGrammaticSymbols.insert(situation->body.at(situation->point));
                }

                for_each(UniqueGrammaticSymbols, uniqueGrammaticSymbols, symbol) {
                    Situations goToSits = goTo(grammar, canonicalSet.at(i).situations, *symbol);

                    for (size_t j = 0; j < canonicalSet.size(); ++j) {
                        if (goToSits == canonicalSet.at(j).situations) {
                            out << "I" << i << " -> " << "I" << j << " [label=\""
                              << (symbol->isTerminal ? lexer::terminalName(symbol->value, terminalNames)
                                                     : nonTerminalName(symbol->value, nonTerminalNames)) << "\"]" << std::endl;
                        }
                    }
                }
            }
            out << "}";
            return out;
        }